

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroIntMapEntriesPopulatedInReflection_Test::TestBody
          (NoFieldPresenceTest_TestNonZeroIntMapEntriesPopulatedInReflection_Test *this)

{
  FieldDescriptor *field;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  Message *x;
  pointer *__ptr;
  char *pcVar1;
  Metadata MVar2;
  Metadata MVar3;
  string_view name;
  AssertionResult gtest_ar;
  TestAllMapTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertHelper local_110;
  undefined1 local_108 [8];
  UntypedMapBase *local_100;
  undefined1 local_e8 [216];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_e8,(Arena *)0x0);
  MVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  MVar3 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetMetadata
                    ((TestAllMapTypes *)
                     proto2_nofieldpresence_unittest::_TestAllMapTypes_default_instance_);
  name._M_str = "map_int32_foreign_enum";
  name._M_len = 0x16;
  field = Descriptor::FindFieldByName(MVar3.descriptor,name);
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_118._M_head_impl._4_4_ << 0x20);
  local_110.data_._0_4_ = 2;
  testing::internal::CmpHelperNE<int,unsigned_int>
            ((internal *)local_108,"0","static_cast<uint32_t>(FOREIGN_BAZ)",(int *)&local_118,
             (uint *)&local_110);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x16b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
  }
  else {
    if (local_100 != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    }
    this_00 = protobuf::internal::
              TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MutableMap
                        ((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                          *)(local_e8 + 0x40));
    local_118._M_head_impl._0_4_ = 99;
    Map<int,proto2_nofieldpresence_unittest::ForeignEnum>::TryEmplaceInternal<int_const&>
              ((pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::iterator,_bool>
                *)local_108,this_00,(int *)&local_118);
    *(undefined4 *)(CONCAT71(local_108._1_7_,local_108[0]) + 0xc) = 2;
    local_118._M_head_impl._0_4_ = 1;
    local_110.data_._0_4_ = Reflection::FieldSize(MVar2.reflection,(Message *)local_e8,field);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_108,"1","r->FieldSize(message, field_map_int32_foreign_enum)",
               (int *)&local_118,(int *)&local_110);
    if (local_108[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_100 == (UntypedMapBase *)0x0) {
        pcVar1 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar1 = *(char **)local_100;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x16f,pcVar1);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_118._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_118._M_head_impl + 8))();
      }
    }
    if (local_100 != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    }
    x = Reflection::GetRepeatedMessage(MVar2.reflection,(Message *)local_e8,field,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>::
    operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>
                *)local_108,"enum_map_entry",x);
    if (local_108[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_100 == (UntypedMapBase *)0x0) {
        pcVar1 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar1 = *(char **)local_100;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x174,pcVar1);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_118._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_118._M_head_impl + 8))();
      }
    }
    if (local_100 != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    }
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>
    ::operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>
                  *)local_108,"enum_map_entry",x);
    if (local_108[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_100 == (UntypedMapBase *)0x0) {
        pcVar1 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar1 = *(char **)local_100;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x175,pcVar1);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_118._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_118._M_head_impl + 8))();
      }
    }
    if (local_100 != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    }
    local_118._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::no_presence_map_test_internal::MapEntryListFieldsSizeMatcherP<unsigned_long>>
    ::operator()(local_108,(char *)&local_118,(Message *)"enum_map_entry");
    if (local_108[0] != (internal)0x0) goto LAB_008a1be4;
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (UntypedMapBase *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x176,pcVar1);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if (local_118._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_118._M_head_impl + 8))();
  }
LAB_008a1be4:
  if (local_100 != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_e8);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroIntMapEntriesPopulatedInReflection) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_enum =
      desc->FindFieldByName("map_int32_foreign_enum");

  // Set nonzero values for key-value pairs and test that.
  ASSERT_NE(0, static_cast<uint32_t>(FOREIGN_BAZ));
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  // Map entries show up on reflection.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_foreign_enum));
  const google::protobuf::Message& enum_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_foreign_enum, /*index=*/0);

  // HasField for both key and value returns true.
  EXPECT_THAT(enum_map_entry, MapEntryHasKey());
  EXPECT_THAT(enum_map_entry, MapEntryHasValue());
  EXPECT_THAT(enum_map_entry, MapEntryListFieldsSize(2));
}